

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_layer.c
# Opt level: O2

void branch_layer_forward(layer_t *l)

{
  long lVar1;
  long lVar2;
  int b;
  int iVar3;
  int i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 < *(int *)&l[1].func; lVar4 = lVar4 + 1) {
    lVar1 = *(long *)**(undefined8 **)(l[1].in.val + lVar4 * 4 + 2);
    for (iVar3 = 0; iVar3 < l->n->batch; iVar3 = iVar3 + 1) {
      lVar2 = (long)*(int *)(lVar1 + 0x28);
      memcpy((void *)(lVar2 * iVar3 * 4 + *(long *)(lVar1 + 8)),
             (l->in).val + (long)(int)l[1].in.val[lVar4 * 4] + (long)(l->in).size * (long)iVar3,
             lVar2 << 2);
    }
    net_forward(*(net_t **)(l[1].in.val + lVar4 * 4 + 2));
  }
  return;
}

Assistant:

static void branch_layer_forward(layer_t *l)
{
    int i = 0, b = 0;
    branch_layer_t *me = (branch_layer_t *)l;

    for (i = 0; i < me->num; ++i)
    {
        layer_t *branch = me->branch[i].n->layer[0];
        for (b = 0; b < l->n->batch; ++b)
            memcpy(&branch->in.val[b * branch->in.size], &l->in.val[b * l->in.size + me->branch[i].offset],
                   branch->in.size * sizeof(data_val_t));

        net_forward(me->branch[i].n);
    }
}